

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O3

void predict_or_learn_multi<true,true>(nn *n,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  uchar **ppuVar2;
  polylabel *ppVar3;
  uint64_t *puVar4;
  float fVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  shared_data *psVar10;
  _func_void_shared_data_ptr_float *p_Var11;
  loss_function *plVar12;
  bool *pbVar13;
  polyprediction *ppVar14;
  shared_data *psVar15;
  uint64_t uVar16;
  _func_void_int_string_v_array<char> *p_Var17;
  float fVar18;
  label_t lVar19;
  wclass *pwVar20;
  size_t sVar21;
  v_array<char> vVar22;
  bool bVar23;
  uint uVar24;
  uint64_t uVar25;
  ostream *poVar26;
  undefined8 uVar27;
  long lVar28;
  polyprediction *ppVar29;
  features *pfVar30;
  char *pcVar31;
  features *pfVar32;
  features *pfVar33;
  code *pcVar34;
  vw *pvVar35;
  uint i;
  float *pfVar36;
  undefined1 *puVar37;
  ulong uVar38;
  ulong uVar39;
  byte bVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float extraout_XMM0_Da;
  float fVar44;
  features save_nn_output_namespace;
  ostringstream outputStringStream;
  shared_data sd;
  undefined8 in_stack_fffffffffffffc48;
  undefined4 uVar45;
  float fVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  float fVar49;
  undefined4 uVar51;
  example *peVar50;
  undefined4 in_stack_fffffffffffffc60;
  float local_378;
  float local_374;
  float local_370;
  undefined1 *local_310;
  undefined1 local_300 [16];
  char local_2f0 [96];
  float local_290;
  undefined1 local_288 [376];
  shared_data local_110;
  
  bVar40 = 0;
  pvVar35 = n->all;
  iVar6 = pvVar35->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,pvVar35);
    pvVar35 = n->all;
  }
  memcpy(&local_110,pvVar35->sd,0xe0);
  psVar10 = pvVar35->sd;
  pvVar35->sd = &local_110;
  if (n->dropout == false) {
    fVar41 = 1.0;
  }
  else {
    fVar41 = 2.0;
  }
  fVar5 = (ec->l).simple.label;
  p_Var11 = n->all->set_minmax;
  plVar12 = n->all->loss;
  pbVar13 = n->dropped_out;
  ppVar14 = n->hidden_units_pred;
  uVar45 = SUB84(n->hiddenbias_pred,0);
  uVar47 = (undefined4)((ulong)n->hiddenbias_pred >> 0x20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar15 = n->all->sd;
  fVar49 = psVar15->min_label;
  psVar15->min_label = -3.0;
  psVar15 = n->all->sd;
  fVar46 = psVar15->max_label;
  psVar15->max_label = 3.0;
  uVar16 = (ec->super_example_predict).ft_offset;
  uVar25 = uVar16;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
    uVar25 = 0;
  }
  peVar50 = &n->hiddenbias;
  (n->hiddenbias).super_example_predict.ft_offset = uVar25;
  uVar24 = n->k;
  uVar39 = (ulong)uVar24;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    if (uVar39 != 0) {
      lVar28 = 0;
      do {
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar50);
        fVar42 = (n->hiddenbias).pred.scalar;
        fVar43 = *(float *)((long)&(n->hiddenbias).pred + 4);
        fVar44 = *(float *)((long)&(n->hiddenbias).pred + 8);
        fVar18 = *(float *)((long)&(n->hiddenbias).pred + 0xc);
        *(undefined1 (*) [16])(CONCAT44(uVar47,uVar45) + 0x10 + lVar28) =
             *(undefined1 (*) [16])((long)&(n->hiddenbias).pred + 0x10);
        pfVar36 = (float *)(CONCAT44(uVar47,uVar45) + lVar28);
        *pfVar36 = fVar42;
        pfVar36[1] = fVar43;
        pfVar36[2] = fVar44;
        pfVar36[3] = fVar18;
        uVar25 = (ulong)*(uint *)(base + 0xe0) + (n->hiddenbias).super_example_predict.ft_offset;
        (n->hiddenbias).super_example_predict.ft_offset = uVar25;
        lVar28 = lVar28 + 0x20;
      } while (uVar39 << 5 != lVar28);
    }
    uVar25 = uVar25 - uVar24 * *(int *)(base + 0xe0);
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar50,uVar39,
               *(undefined8 *)(base + 0xe0),CONCAT44(uVar47,uVar45),1);
    uVar25 = (n->hiddenbias).super_example_predict.ft_offset;
  }
  (n->hiddenbias).super_example_predict.ft_offset = uVar25;
  uVar24 = n->k;
  if (uVar24 == 0) {
    pcVar34 = *(code **)(base + 0x40);
    if (pcVar34 != (code *)0x0) {
      uVar39 = 0;
      goto LAB_001bd1b6;
    }
    uVar25 = (ec->super_example_predict).ft_offset;
    uVar24 = 0;
  }
  else {
    uVar38 = 0;
    pfVar36 = (float *)CONCAT44(uVar47,uVar45);
    do {
      if ((*pfVar36 == 0.0) && (!NAN(*pfVar36))) {
        fVar42 = merand48(&n->all->random_state);
        (n->hiddenbias).l.simple.label = fVar42 + -0.5;
        puVar4 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar4 = *puVar4 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar38);
        (**(code **)(base + 0x28))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar50);
        puVar4 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar4 = *puVar4 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar38);
        (n->hiddenbias).l.multi.label = 0x7f7fffff;
        uVar24 = n->k;
      }
      uVar38 = uVar38 + 1;
      uVar39 = (ulong)uVar24;
      pfVar36 = pfVar36 + 8;
    } while (uVar38 < uVar39);
    pcVar34 = *(code **)(base + 0x40);
    if (pcVar34 != (code *)0x0) {
LAB_001bd1b6:
      (*pcVar34)(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar39,
                 *(undefined8 *)(base + 0xe0),ppVar14,1);
      uVar25 = (ec->super_example_predict).ft_offset;
      goto LAB_001bd203;
    }
    if (uVar24 == 0) {
      uVar25 = (ec->super_example_predict).ft_offset;
    }
    else {
      uVar48 = (undefined4)(uVar39 << 5);
      uVar51 = (undefined4)((uVar39 << 5) >> 0x20);
      puVar37 = (undefined1 *)0x0;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar42 = (ec->pred).scalar;
        fVar43 = *(float *)((long)&ec->pred + 4);
        fVar44 = *(float *)((long)&ec->pred + 8);
        fVar18 = *(float *)((long)&ec->pred + 0xc);
        *(undefined1 (*) [16])((long)&(ppVar14->scalars).end_array + (long)puVar37) =
             *(undefined1 (*) [16])((long)&ec->pred + 0x10);
        pfVar36 = (float *)((long)ppVar14 + (long)puVar37);
        *pfVar36 = fVar42;
        pfVar36[1] = fVar43;
        pfVar36[2] = fVar44;
        pfVar36[3] = fVar18;
        uVar25 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
        (ec->super_example_predict).ft_offset = uVar25;
        puVar37 = puVar37 + 0x20;
        peVar50 = (example *)CONCAT44(uVar51,uVar48);
      } while (peVar50 != (example *)puVar37);
    }
  }
  uVar25 = uVar25 - uVar24 * *(int *)(base + 0xe0);
LAB_001bd203:
  uVar48 = (undefined4)((ulong)peVar50 >> 0x20);
  (ec->super_example_predict).ft_offset = uVar25;
  if (n->k != 0) {
    uVar39 = 0;
    do {
      if (n->dropout == true) {
        fVar42 = merand48(&n->xsubi);
        bVar23 = fVar42 < 0.5;
      }
      else {
        bVar23 = false;
      }
      pbVar13[uVar39] = bVar23;
      uVar39 = uVar39 + 1;
      uVar24 = n->k;
    } while (uVar39 < uVar24);
    pfVar32 = ec->passthrough;
    if (uVar24 != 0 && pfVar32 != (features *)0x0) {
      uVar38 = 1;
      uVar39 = 1;
      lVar28 = 0;
      while( true ) {
        if (pfVar32 != (features *)0x0) {
          features::push_back(pfVar32,*(feature_value *)(CONCAT44(uVar47,uVar45) + lVar28),
                              (ulong)((int)uVar38 - 1) ^ 0x398d9fda640553);
          if (ec->passthrough != (features *)0x0) {
            features::push_back(ec->passthrough,*(feature_value *)((long)ppVar14 + lVar28),
                                uVar38 ^ 0x398d9fda640553);
          }
        }
        uVar24 = n->k;
        if (uVar24 <= uVar39) break;
        pfVar32 = ec->passthrough;
        lVar28 = lVar28 + 0x20;
        uVar38 = (ulong)((int)uVar38 + 2);
        uVar39 = uVar39 + 1;
      }
    }
    uVar48 = (undefined4)((ulong)peVar50 >> 0x20);
    if (uVar24 != 0 && 0 < iVar6) {
      uVar39 = 0;
      ppVar29 = ppVar14;
      do {
        if (uVar39 != 0) {
          local_2f0[0] = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
        }
        poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)local_288);
        local_2f0[0] = ':';
        std::__ostream_insert<char,std::char_traits<char>>(poVar26,local_2f0,1);
        poVar26 = std::ostream::_M_insert<double>((double)ppVar29->scalar);
        local_2f0[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar26,local_2f0,1);
        fVar43 = ppVar29->scalar * -2.0 * 1.442695;
        fVar42 = -126.0;
        if (-126.0 <= fVar43) {
          fVar42 = fVar43;
        }
        fVar43 = (fVar42 - (float)(int)fVar42) + (float)(-(uint)(fVar43 < 0.0) & 0x3f800000);
        std::ostream::_M_insert<double>
                  ((double)(2.0 / ((float)(long)((fVar43 * -1.4901291 +
                                                 27.728024 / (4.8425255 - fVar43) +
                                                 fVar42 + 121.274055) * 8388608.0) + 1.0) + -1.0));
        uVar48 = (undefined4)((ulong)peVar50 >> 0x20);
        uVar39 = uVar39 + 1;
        ppVar29 = ppVar29 + 1;
      } while (uVar39 < n->k);
    }
  }
  ppVar3 = &ec->l;
  n->all->loss = plVar12;
  n->all->set_minmax = p_Var11;
  n->all->sd->min_label = fVar49;
  n->all->sd->max_label = fVar46;
  (ec->super_example_predict).ft_offset = uVar16;
  peVar50 = &n->outputweight;
  ppVar1 = &(n->output_layer).l;
  pfVar32 = (ec->super_example_predict).feature_space + 0x81;
  uVar27 = CONCAT71((int7)((ulong)&ec->tag >> 8),1);
  local_374 = 0.0;
  local_370 = 0.0;
  local_378 = 0.0;
  while( true ) {
    uVar24 = (uint)uVar27;
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (ec->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar15 = n->all->sd;
    fVar49 = psVar15->min_label;
    psVar15->min_label = -1.0;
    psVar15 = n->all->sd;
    fVar46 = psVar15->max_label;
    psVar15->max_label = 1.0;
    if (n->k != 0) {
      uVar39 = 0;
      ppVar29 = ppVar14;
      do {
        fVar42 = 0.0;
        if (pbVar13[uVar39] == false) {
          fVar43 = ppVar29->scalar * -2.0 * 1.442695;
          fVar42 = -126.0;
          if (-126.0 <= fVar43) {
            fVar42 = fVar43;
          }
          fVar43 = (fVar42 - (float)(int)fVar42) + (float)(-(uint)(fVar43 < 0.0) & 0x3f800000);
          fVar42 = (2.0 / ((float)(long)((fVar43 * -1.4901291 +
                                         27.728024 / (4.8425255 - fVar43) + fVar42 + 121.274055) *
                                        8388608.0) + 1.0) + -1.0) * fVar41;
        }
        (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar39] = fVar42;
        (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar42 * fVar42;
        (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
             fVar42 * fVar42 +
             (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
        *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
             (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar39];
        uVar7 = n->k;
        puVar4 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar4 = *puVar4 + (ulong)(*(int *)(base + 0xe0) * uVar7);
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar50);
        puVar4 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar4 = *puVar4 - (ulong)(uVar7 * *(int *)(base + 0xe0));
        fVar42 = (n->outputweight).pred.scalar;
        if ((fVar42 == 0.0) && (!NAN(fVar42))) {
          uVar8 = n->k;
          fVar42 = merand48(&n->all->random_state);
          (n->outputweight).l.simple.label = (fVar42 + -0.5) / SQRT((float)uVar8);
          uVar7 = n->k;
          puVar4 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar4 = *puVar4 + (ulong)(*(int *)(base + 0xe0) * uVar7);
          (**(code **)(base + 0x38))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar50);
          puVar4 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar4 = *puVar4 - (ulong)(uVar7 * *(int *)(base + 0xe0));
          (n->outputweight).l.multi.label = 0x7f7fffff;
        }
        uVar39 = uVar39 + 1;
        ppVar29 = ppVar29 + 1;
      } while (uVar39 < n->k);
    }
    n->all->loss = plVar12;
    n->all->set_minmax = p_Var11;
    n->all->sd->min_label = fVar49;
    n->all->sd->max_label = fVar46;
    if (n->inpass == false) {
      uVar16 = (ec->super_example_predict).ft_offset;
      (n->output_layer).super_example_predict.ft_offset = uVar16;
      (n->output_layer).l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
      lVar19 = ppVar3->multi;
      pwVar20 = (ec->l).cs.costs._end;
      sVar21 = (ec->l).cs.costs.erase_count;
      (n->output_layer).l.cs.costs.end_array = (ec->l).cs.costs.end_array;
      (n->output_layer).l.cs.costs.erase_count = sVar21;
      ppVar1->multi = lVar19;
      (n->output_layer).l.cs.costs._end = pwVar20;
      (n->output_layer).weight = ec->weight;
      (n->output_layer).partial_prediction = 0.0;
      uVar7 = n->k;
      (n->output_layer).super_example_predict.ft_offset = *(int *)(base + 0xe0) * uVar7 + uVar16;
      (**(code **)(base + 0x28))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->output_layer);
      puVar4 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar4 = *puVar4 - (ulong)(uVar7 * *(int *)(base + 0xe0));
      (ec->l).cb_eval.event.costs.erase_count = (n->output_layer).l.cb_eval.event.costs.erase_count;
      lVar19 = ppVar1->multi;
      pwVar20 = (n->output_layer).l.cs.costs._end;
      sVar21 = (n->output_layer).l.cs.costs.erase_count;
      (ec->l).cs.costs.end_array = (n->output_layer).l.cs.costs.end_array;
      (ec->l).cs.costs.erase_count = sVar21;
      ppVar3->multi = lVar19;
      (ec->l).cs.costs._end = pwVar20;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&nn_output_namespace);
      pfVar30 = pfVar32;
      pcVar31 = local_2f0;
      for (lVar28 = 0xd; lVar28 != 0; lVar28 = lVar28 + -1) {
        *(float **)pcVar31 = (pfVar30->values)._begin;
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar40 * -0x10 + 8);
        pcVar31 = pcVar31 + ((ulong)bVar40 * -2 + 1) * 8;
      }
      pfVar30 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar33 = pfVar32;
      for (lVar28 = 0xc; lVar28 != 0; lVar28 = lVar28 + -1) {
        (pfVar33->values)._begin = (pfVar30->values)._begin;
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar40 * -0x10 + 8);
        pfVar33 = (features *)((long)pfVar33 + (ulong)bVar40 * -0x10 + 8);
      }
      (ec->super_example_predict).feature_space[0x81].sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      ec->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           ec->total_sum_feat_sq;
      uVar7 = n->k;
      puVar4 = &(ec->super_example_predict).ft_offset;
      *puVar4 = *puVar4 + (ulong)(*(int *)(base + 0xe0) * uVar7);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar4 = &(ec->super_example_predict).ft_offset;
      *puVar4 = *puVar4 - (ulong)(uVar7 * *(int *)(base + 0xe0));
      (n->output_layer).partial_prediction = ec->partial_prediction;
      (n->output_layer).loss = ec->loss;
      ec->total_sum_feat_sq =
           ec->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      pcVar31 = local_2f0;
      pfVar30 = pfVar32;
      for (lVar28 = 0xc; lVar28 != 0; lVar28 = lVar28 + -1) {
        (pfVar30->values)._begin = *(float **)pcVar31;
        pcVar31 = pcVar31 + ((ulong)bVar40 * -2 + 1) * 8;
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar40 * -0x10 + 8);
      }
      (ec->super_example_predict).feature_space[0x81].sum_feat_sq = local_290;
      ppuVar2 = &(ec->super_example_predict).indices._end;
      *ppuVar2 = *ppuVar2 + -1;
    }
    fVar42 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar42;
    if (0 < iVar6) {
      local_2f0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      std::ostream::_M_insert<double>((double)(n->output_layer).partial_prediction);
      p_Var17 = n->all->print_text;
      iVar9 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar22._end._0_4_ = fVar46;
      vVar22._begin = (char *)in_stack_fffffffffffffc48;
      vVar22._end._4_4_ = uVar47;
      vVar22.end_array._0_4_ = fVar49;
      vVar22.end_array._4_4_ = uVar48;
      vVar22.erase_count._0_4_ = in_stack_fffffffffffffc60;
      vVar22.erase_count._4_4_ = uVar24;
      (*p_Var17)(iVar9,(string)ec->tag,vVar22);
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
    }
    pvVar35 = n->all;
    if ((pvVar35->training == true) &&
       (((fVar5 != 3.4028235e+38 || (NAN(fVar5))) &&
        ((*pvVar35->loss->_vptr_loss_function[6])(pvVar35->loss,pvVar35->sd),
        extraout_XMM0_Da != 0.0)))) {
      n->all->loss = n->squared_loss;
      n->all->set_minmax = noop_mm;
      psVar15 = n->all->sd;
      fVar49 = psVar15->min_label;
      psVar15->min_label = -3.0;
      psVar15 = n->all->sd;
      fVar46 = psVar15->max_label;
      psVar15->max_label = 3.0;
      uVar16 = (ec->super_example_predict).ft_offset;
      if (n->multitask == true) {
        (ec->super_example_predict).ft_offset = 0;
      }
      if (n->k != 0) {
        uVar39 = 0;
        ppVar29 = ppVar14;
        fVar42 = extraout_XMM0_Da;
        do {
          if (pbVar13[uVar39] == false) {
            fVar43 = (n->output_layer).super_example_predict.feature_space[0x81].values._begin
                     [uVar39];
            *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
                 (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar39]
            ;
            uVar7 = n->k;
            puVar4 = &(n->outputweight).super_example_predict.ft_offset;
            *puVar4 = *puVar4 + (ulong)(*(int *)(base + 0xe0) * uVar7);
            (**(code **)(base + 0x30))
                      (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar50);
            puVar4 = &(n->outputweight).super_example_predict.ft_offset;
            *puVar4 = *puVar4 - (ulong)(uVar7 * *(int *)(base + 0xe0));
            fVar44 = GD::finalize_prediction
                               (n->all->sd,
                                (n->outputweight).pred.scalar * -0.5 * fVar42 *
                                (1.0 - (fVar43 / fVar41) * (fVar43 / fVar41)) * fVar41 +
                                ppVar29->scalar);
            (ec->l).simple.label = fVar44;
            fVar43 = ppVar29->scalar;
            (ec->pred).scalar = fVar43;
            if ((fVar44 != fVar43) || (NAN(fVar44) || NAN(fVar43))) {
              puVar4 = &(ec->super_example_predict).ft_offset;
              *puVar4 = *puVar4 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar39);
              (**(code **)(base + 0x38))
                        (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
              puVar4 = &(ec->super_example_predict).ft_offset;
              *puVar4 = *puVar4 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar39);
            }
          }
          uVar39 = uVar39 + 1;
          ppVar29 = ppVar29 + 1;
        } while (uVar39 < n->k);
      }
      n->all->loss = plVar12;
      n->all->set_minmax = p_Var11;
      n->all->sd->min_label = fVar49;
      n->all->sd->max_label = fVar46;
      (ec->super_example_predict).ft_offset = uVar16;
    }
    (ppVar3->simple).label = fVar5;
    if ((uVar24 & 1) != 0) {
      local_370 = n->prediction;
      local_374 = (n->output_layer).partial_prediction;
      local_378 = (n->output_layer).loss;
    }
    if (((byte)uVar24 & 1 & n->dropout) != 1) break;
    uVar27 = 0;
    if (n->k != 0) {
      uVar39 = 0;
      do {
        pbVar13[uVar39] = (bool)(pbVar13[uVar39] ^ 1);
        uVar39 = uVar39 + 1;
      } while (uVar39 < n->k);
      uVar27 = 0;
    }
  }
  ec->partial_prediction = local_374;
  (ec->pred).scalar = local_370;
  ec->loss = local_378;
  n->all->sd = psVar10;
  (*n->all->set_minmax)(n->all->sd,local_110.min_label);
  (*n->all->set_minmax)(n->all->sd,local_110.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base((ios_base *)(local_288 + 0x70));
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}